

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

pointer __thiscall
google::protobuf::RepeatedField<unsigned_long>::Mutable
          (RepeatedField<unsigned_long> *this,int index)

{
  Arena *pAVar1;
  int iVar2;
  unsigned_long *puVar3;
  void *ptr;
  RepeatedField<unsigned_long> *this_00;
  Arena *this_01;
  RepeatedField<unsigned_long> *unaff_R14;
  Arena *pAStack_40;
  Arena *pAStack_38;
  RepeatedField<unsigned_long> *pRStack_30;
  
  pAVar1 = (Arena *)(ulong)(uint)index;
  if (index < 0) {
    pRStack_30 = (RepeatedField<unsigned_long> *)0x1458cc;
    Mutable();
  }
  else {
    pRStack_30 = (RepeatedField<unsigned_long> *)0x14589c;
    iVar2 = internal::SooRep::size
                      (&this->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    unaff_R14 = this;
    if (index < iVar2) {
      pRStack_30 = (RepeatedField<unsigned_long> *)0x1458b2;
      puVar3 = elements(this,(undefined1  [16])
                             ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
      return puVar3 + (long)pAVar1;
    }
  }
  pRStack_30 = (RepeatedField<unsigned_long> *)
               Arena::CreateArenaCompatible<google::protobuf::RepeatedField<unsigned_long>>;
  this_01 = pAVar1;
  Mutable();
  pAStack_38 = pAVar1;
  pRStack_30 = unaff_R14;
  if (this_01 == (Arena *)0x0) {
    this_00 = (RepeatedField<unsigned_long> *)operator_new(0x10);
    RepeatedField(this_00,(Arena *)0x0);
  }
  else {
    ptr = Arena::Allocate(this_01,0x10);
    pAStack_40 = this_01;
    this_00 = Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_long>>::
              Construct<google::protobuf::Arena*>(ptr,&pAStack_40);
  }
  return (pointer)this_00;
}

Assistant:

inline Element* RepeatedField<Element>::Mutable(int index)
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  ABSL_DCHECK_GE(index, 0);
  ABSL_DCHECK_LT(index, size());
  return &elements(is_soo())[index];
}